

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceAtomicOperations_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,ShaderFunction function,DataType memDataType,DataType dataDataType,
          DataType compareDataType)

{
  undefined4 uVar1;
  bool bVar2;
  RenderContext *pRVar3;
  ostream *poVar4;
  ShaderType shaderType_00;
  char *local_2d8;
  allocator<char> local_2a9;
  string local_2a8;
  string local_288;
  allocator<char> local_261;
  string local_260;
  string local_240;
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  string local_1d8;
  deUint32 local_1b8;
  ContextType local_1a4;
  undefined1 local_1a0 [8];
  ostringstream source;
  DataType dataDataType_local;
  DataType memDataType_local;
  ShaderFunction function_local;
  ShaderType shaderType_local;
  NegativeTestContext *ctx_local;
  
  shaderType_00 = shaderType;
  source._368_4_ = memDataType;
  source._372_4_ = function;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  pRVar3 = NegativeTestContext::getRenderContext((NegativeTestContext *)this);
  local_1a4.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_1b8 = (deUint32)glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(local_1a4,(ApiType)local_1b8);
  if (bVar2) {
    local_2d8 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_2d8 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  poVar4 = std::operator<<((ostream *)local_1a0,local_2d8);
  poVar4 = std::operator<<(poVar4,"\n");
  getShaderInitialization_abi_cxx11_
            (&local_1d8,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar4 = std::operator<<(poVar4,(string *)&local_1d8);
  uVar1 = source._372_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"mem",&local_219);
  NegativeTestShared::anon_unknown_0::declareBuffer(&local_1f8,uVar1,&local_218);
  poVar4 = std::operator<<(poVar4,(string *)&local_1f8);
  poVar4 = std::operator<<(poVar4,"void main()\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"\tmediump ");
  uVar1 = source._368_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"data",&local_261);
  NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
            (&local_240,uVar1,&local_260);
  std::operator<<(poVar4,(string *)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::string::~string((string *)&local_1d8);
  switch(shaderType) {
  case 0x10:
    std::operator<<((ostream *)local_1a0,"    atomicAdd(mem, data);\n");
    break;
  case 0x11:
    std::operator<<((ostream *)local_1a0,"    atomicMin(mem, data);\n");
    break;
  case 0x12:
    std::operator<<((ostream *)local_1a0,"    atomicMax(mem, data);\n");
    break;
  case 0x13:
    std::operator<<((ostream *)local_1a0,"    atomicAnd(mem, data);\n");
    break;
  case 0x14:
    std::operator<<((ostream *)local_1a0,"    atomicOr(mem, data);\n");
    break;
  case 0x15:
    std::operator<<((ostream *)local_1a0,"    atomicXor(mem, data);\n");
    break;
  case 0x16:
    std::operator<<((ostream *)local_1a0,"    atomicExchange(mem, data);\n");
    break;
  case 0x17:
    poVar4 = std::operator<<((ostream *)local_1a0,"\tmediump ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"compare",&local_2a9);
    NegativeTestShared::anon_unknown_0::declareAndInitializeShaderVariable
              (&local_288,dataDataType,&local_2a8);
    poVar4 = std::operator<<(poVar4,(string *)&local_288);
    std::operator<<(poVar4,"    atomicCompSwap(mem, compare, data);\n");
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
  }
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSourceAtomicOperations (NegativeTestContext& ctx, glu::ShaderType shaderType, ShaderFunction function, glu::DataType memDataType, glu::DataType dataDataType, glu::DataType compareDataType)
{
	DE_ASSERT(SHADER_FUNCTION_ATOMIC_ADD <= function && function <= SHADER_FUNCTION_ATOMIC_COMP_SWAP);

	std::ostringstream source;

	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderInitialization(ctx, shaderType)
			<< declareBuffer(memDataType, "mem")
			<< "void main()\n"
			<< "{\n"
			<< "	mediump " << declareAndInitializeShaderVariable(dataDataType, "data");

	switch (function)
	{
		case SHADER_FUNCTION_ATOMIC_ADD:		source << "    atomicAdd(mem, data);\n";		break;
		case SHADER_FUNCTION_ATOMIC_MIN:		source << "    atomicMin(mem, data);\n";		break;
		case SHADER_FUNCTION_ATOMIC_MAX:		source << "    atomicMax(mem, data);\n";		break;
		case SHADER_FUNCTION_ATOMIC_AND:		source << "    atomicAnd(mem, data);\n";		break;
		case SHADER_FUNCTION_ATOMIC_OR:			source << "    atomicOr(mem, data);\n";			break;
		case SHADER_FUNCTION_ATOMIC_XOR:		source << "    atomicXor(mem, data);\n";		break;
		case SHADER_FUNCTION_ATOMIC_EXCHANGE:	source << "    atomicExchange(mem, data);\n";	break;
		case SHADER_FUNCTION_ATOMIC_COMP_SWAP:
			source	<< "	mediump " << declareAndInitializeShaderVariable(compareDataType, "compare")
					<< "    atomicCompSwap(mem, compare, data);\n";
			break;

		default:
			DE_FATAL("Unsupported shader function.");
	}

	source << "}\n";

	return source.str();
}